

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O1

void __thiscall
utFBXImporterExporter_importEmbeddedAsciiTest_Test::TestBody
          (utFBXImporterExporter_importEmbeddedAsciiTest_Test *this)

{
  bool bVar1;
  char *message;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  aiScene *scene;
  Importer importer;
  aiMaterial *mat;
  aiTextureMapMode modes [2];
  aiString path;
  AssertHelper local_470;
  AssertHelper local_468;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  string local_458;
  aiScene *local_438;
  AssertHelper local_430;
  Importer local_428;
  aiMaterial *local_420;
  aiTextureMapMode local_418 [2];
  undefined1 local_410 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408 [128];
  
  Assimp::Importer::Importer(&local_428);
  local_438 = Assimp::Importer::ReadFile
                        (&local_428,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/embedded_ascii/box.FBX"
                         ,0x400);
  local_458._M_dataplus._M_p = (pointer)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_410,"nullptr","scene",(void **)&local_458,&local_438);
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_458);
    if (local_408[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_408[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    if ((long *)local_458._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_458._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_458._M_dataplus._M_p + 8))();
      }
      local_458._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_408,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_458._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_410,"1u","scene->mNumMaterials",(uint *)&local_458,
             &local_438->mNumMaterials);
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_458);
    if (local_408[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_408[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    if ((long *)local_458._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_458._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_458._M_dataplus._M_p + 8))();
      }
      local_458._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_408,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_420 = *local_438->mMaterials;
  local_458._M_dataplus._M_p = (pointer)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)local_410,"nullptr","mat",(void **)&local_458,&local_420);
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_458);
    if (local_408[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_408[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    if ((long *)local_458._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_458._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_458._M_dataplus._M_p + 8))();
      }
      local_458._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_408,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_408,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_410._0_4_ = 0;
    local_410[4] = '\0';
    memset(local_410 + 5,0x1b,0x3ff);
    local_468.data_ = (AssertHelperData *)((ulong)local_468.data_._4_4_ << 0x20);
    pcVar2 = (char *)0x0;
    local_470.data_._0_4_ =
         aiGetMaterialTexture
                   (local_420,aiTextureType_DIFFUSE,0,(aiString *)local_410,(aiTextureMapping *)0x0,
                    (uint *)0x0,(ai_real *)0x0,(aiTextureOp *)0x0,local_418,(uint *)0x0);
    testing::internal::CmpHelperEQ<aiReturn,aiReturn>
              ((internal *)&local_458,"aiReturn_SUCCESS",
               "mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes)"
               ,(aiReturn *)&local_468,(aiReturn *)&local_470);
    if ((char)local_458._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_468);
      if ((undefined8 *)local_458._M_string_length == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_458._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfc,message);
      testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      if (local_468.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_468.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_468.data_ + 8))();
        }
        local_468.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_458._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_458,"path.C_Str()","\"..\\\\..\\\\..\\\\Desktop\\\\uv_test.png\"",
               local_410 + 4,"..\\..\\..\\Desktop\\uv_test.png");
    if ((char)local_458._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_468);
      if ((undefined8 *)local_458._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_458._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      if (local_468.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_468.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_468.data_ + 8))();
        }
        local_468.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_458._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_458._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_468.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_458,"1u","scene->mNumTextures",(uint *)&local_468,
                 &local_438->mNumTextures);
      if ((char)local_458._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_468);
        if ((undefined8 *)local_458._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_458._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_470,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0xff,pcVar2);
        testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_468);
        testing::internal::AssertHelper::~AssertHelper(&local_470);
        if (local_468.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_468.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_468.data_ + 8))();
          }
          local_468.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_458._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_458._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar1 = (*local_438->mTextures)->pcData == (aiTexel *)0x0;
        local_468.data_._0_1_ = !bVar1;
        local_460.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_470);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_458,(internal *)&local_468,
                     (AssertionResult *)"scene->mTextures[0]->pcData","false","true",pcVar2);
          testing::internal::AssertHelper::AssertHelper
                    (&local_430,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x100,local_458._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_470);
          testing::internal::AssertHelper::~AssertHelper(&local_430);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          if (local_470.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_470.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_470.data_ + 8))();
            }
            local_470.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_460,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_460,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_468.data_._0_4_ = 0x6b388;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&local_458,"439176u","scene->mTextures[0]->mWidth",
                     (uint *)&local_468,&(*local_438->mTextures)->mWidth);
          if ((char)local_458._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_468);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_468.data_)->line,
                       "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture"
                       ,0x5a);
            if ((undefined8 *)local_458._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_458._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_470,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x101,pcVar2);
            testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_468);
            testing::internal::AssertHelper::~AssertHelper(&local_470);
            if (local_468.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_468.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_468.data_ + 8))();
              }
              local_468.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_458._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
  }
  Assimp::Importer::~Importer(&local_428);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importEmbeddedAsciiTest) {
    // see https://github.com/assimp/assimp/issues/1957
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/embedded_ascii/box.FBX", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(1u, scene->mNumMaterials);
    aiMaterial *mat = scene->mMaterials[0];
    ASSERT_NE(nullptr, mat);

    aiString path;
    aiTextureMapMode modes[2];
    EXPECT_EQ(aiReturn_SUCCESS, mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes));
    ASSERT_STREQ(path.C_Str(), "..\\..\\..\\Desktop\\uv_test.png");

    ASSERT_EQ(1u, scene->mNumTextures);
    ASSERT_TRUE(scene->mTextures[0]->pcData);
    ASSERT_EQ(439176u, scene->mTextures[0]->mWidth) << "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture";
}